

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O0

void __thiscall
capnp::TwoPartyVatNetwork::OutgoingMessageImpl::~OutgoingMessageImpl(OutgoingMessageImpl *this)

{
  OutgoingMessageImpl *this_local;
  
  ~OutgoingMessageImpl(this);
  operator_delete(this,0x128);
  return;
}

Assistant:

OutgoingMessageImpl(TwoPartyVatNetwork& network, uint firstSegmentWordSize)
      : network(network),
        message(firstSegmentWordSize == 0 ? SUGGESTED_FIRST_SEGMENT_WORDS : firstSegmentWordSize) {}